

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O3

string * __thiscall
duckdb::BoxRenderer::ConvertRenderValue
          (string *__return_storage_ptr__,BoxRenderer *this,string *input)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  uint __len;
  string __str;
  char *local_58 [2];
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (input->_M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar3];
      if (0x1f < bVar1) goto LAB_00e4bd9b;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      cVar2 = (input->_M_dataplus)._M_p[uVar3];
      switch(cVar2) {
      case '\a':
        break;
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
        break;
      case '\v':
        break;
      case '\f':
        break;
      case '\r':
        break;
      default:
        if (cVar2 == '\x1b') break;
        __len = 2 - (bVar1 < 10);
        local_58[0] = local_48;
        ::std::__cxx11::string::_M_construct((ulong)local_58,(char)__len);
        ::std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0],__len,(uint)bVar1);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
        goto LAB_00e4bda7;
      }
LAB_00e4bd9b:
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
LAB_00e4bda7:
      uVar3 = uVar3 + 1;
    } while (uVar3 < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::ConvertRenderValue(const string &input) {
	string result;
	result.reserve(input.size());
	for (idx_t c = 0; c < input.size(); c++) {
		data_t byte_value = const_data_ptr_cast(input.c_str())[c];
		if (byte_value < 32) {
			// ASCII control character
			result += "\\";
			switch (input[c]) {
			case 7:
				// bell
				result += 'a';
				break;
			case 8:
				// backspace
				result += 'b';
				break;
			case 9:
				// tab
				result += 't';
				break;
			case 10:
				// newline
				result += 'n';
				break;
			case 11:
				// vertical tab
				result += 'v';
				break;
			case 12:
				// form feed
				result += 'f';
				break;
			case 13:
				// cariage return
				result += 'r';
				break;
			case 27:
				// escape
				result += 'e';
				break;
			default:
				result += to_string(byte_value);
				break;
			}
		} else {
			result += input[c];
		}
	}
	return result;
}